

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O1

LOs __thiscall Omega_h::invert_funnel(Omega_h *this,LOs *ab2a,LO na)

{
  int *piVar1;
  int iVar2;
  Alloc *pAVar3;
  int value;
  int iVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar5;
  int i;
  long lVar6;
  _Alloc_hider _Var7;
  undefined8 uVar8;
  size_t sVar9;
  LOs LVar10;
  Write<int> a2ab;
  type f;
  Write<int> local_88;
  string local_70;
  Write<int> local_50;
  Write<int> local_40;
  
  pAVar3 = (ab2a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    sVar9 = pAVar3->size;
  }
  else {
    sVar9 = (ulong)pAVar3 >> 3;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  Write<int>::Write(&local_88,na + 1,-1,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  Write<int>::set(&local_88,0,0);
  local_70._M_dataplus._M_p = (pointer)(ab2a->write_).shared_alloc_.alloc;
  if (((ulong)local_70._M_dataplus._M_p & 7) == 0 &&
      (Alloc *)local_70._M_dataplus._M_p != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_70._M_dataplus._M_p = (pointer)(((Alloc *)local_70._M_dataplus._M_p)->size * 8 + 1);
    }
    else {
      ((Alloc *)local_70._M_dataplus._M_p)->use_count =
           ((Alloc *)local_70._M_dataplus._M_p)->use_count + 1;
    }
  }
  local_70._M_string_length = (size_type)(ab2a->write_).shared_alloc_.direct_ptr;
  local_70.field_2._M_allocated_capacity = (size_type)local_88.shared_alloc_.alloc;
  if (((ulong)local_88.shared_alloc_.alloc & 7) == 0 && local_88.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_70.field_2._M_allocated_capacity = (local_88.shared_alloc_.alloc)->size * 8 + 1;
    }
    else {
      (local_88.shared_alloc_.alloc)->use_count = (local_88.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_70.field_2._8_8_ = local_88.shared_alloc_.direct_ptr;
  value = (int)(sVar9 >> 2);
  i = value + -1;
  iVar4 = 0;
  if (0 < i) {
    iVar4 = i;
  }
  _Var7._M_p = local_70._M_dataplus._M_p;
  if (((ulong)local_70._M_dataplus._M_p & 7) == 0 &&
      (Alloc *)local_70._M_dataplus._M_p != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      _Var7._M_p = (pointer)(*(long *)local_70._M_dataplus._M_p * 8 + 1);
    }
    else {
      *(int *)(local_70._M_dataplus._M_p + 0x30) = *(int *)(local_70._M_dataplus._M_p + 0x30) + 1;
    }
  }
  uVar8 = local_70.field_2._M_allocated_capacity;
  if ((local_70.field_2._M_allocated_capacity & 7) == 0 &&
      (Alloc *)local_70.field_2._M_allocated_capacity != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      uVar8 = (Alloc *)(*(long *)local_70.field_2._M_allocated_capacity * 8 + 1);
    }
    else {
      *(int *)(local_70.field_2._M_allocated_capacity + 0x30) =
           *(int *)(local_70.field_2._M_allocated_capacity + 0x30) + 1;
    }
  }
  if (1 < value) {
    if (((ulong)_Var7._M_p & 7) == 0 && (Alloc *)_Var7._M_p != (Alloc *)0x0) {
      ((Alloc *)_Var7._M_p)->use_count = ((Alloc *)_Var7._M_p)->use_count + -1;
      _Var7._M_p = (pointer)(((Alloc *)_Var7._M_p)->size * 8 + 1);
    }
    if ((uVar8 & 7) == 0 && (Alloc *)uVar8 != (Alloc *)0x0) {
      ((Alloc *)uVar8)->use_count = ((Alloc *)uVar8)->use_count + -1;
      uVar8 = ((Alloc *)uVar8)->size * 8 + 1;
    }
    entering_parallel = '\0';
    lVar6 = 0;
    do {
      iVar2 = *(int *)(local_70._M_string_length + lVar6 * 4);
      if (iVar2 != *(int *)(local_70._M_string_length + lVar6 * 4 + 4)) {
        *(int *)((long)local_88.shared_alloc_.direct_ptr + (long)iVar2 * 4 + 4) = (int)lVar6 + 1;
      }
      lVar6 = lVar6 + 1;
    } while (iVar4 != (int)lVar6);
    if ((uVar8 & 7) == 0 && (Alloc *)uVar8 != (Alloc *)0x0) {
      piVar1 = &((Alloc *)uVar8)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)uVar8);
        operator_delete((void *)uVar8,0x48);
      }
    }
    if (((ulong)_Var7._M_p & 7) == 0 && (Alloc *)_Var7._M_p != (Alloc *)0x0) {
      piVar1 = &((Alloc *)_Var7._M_p)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)_Var7._M_p);
        operator_delete(_Var7._M_p,0x48);
      }
    }
    _Var7._M_p = (pointer)0x0;
    uVar8 = (Alloc *)0x0;
  }
  if ((uVar8 & 7) == 0 && (Alloc *)uVar8 != (Alloc *)0x0) {
    piVar1 = &((Alloc *)uVar8)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)uVar8);
      operator_delete((void *)uVar8,0x48);
    }
  }
  if (((ulong)_Var7._M_p & 7) == 0 && (Alloc *)_Var7._M_p != (Alloc *)0x0) {
    piVar1 = &((Alloc *)_Var7._M_p)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)_Var7._M_p);
      operator_delete(_Var7._M_p,0x48);
    }
  }
  if (value != 0) {
    iVar4 = Read<int>::get(ab2a,i);
    Write<int>::set(&local_88,iVar4 + 1,value);
  }
  local_40.shared_alloc_.alloc = local_88.shared_alloc_.alloc;
  if (((ulong)local_88.shared_alloc_.alloc & 7) == 0 && local_88.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_40.shared_alloc_.alloc = (Alloc *)((local_88.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_88.shared_alloc_.alloc)->use_count = (local_88.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_40.shared_alloc_.direct_ptr = local_88.shared_alloc_.direct_ptr;
  fill_right(&local_40);
  pAVar3 = local_40.shared_alloc_.alloc;
  if (((ulong)local_40.shared_alloc_.alloc & 7) == 0 && local_40.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_40.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_40.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  local_50.shared_alloc_.alloc = local_88.shared_alloc_.alloc;
  local_50.shared_alloc_.direct_ptr = local_88.shared_alloc_.direct_ptr;
  if ((((ulong)local_88.shared_alloc_.alloc & 7) == 0 &&
       local_88.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_88.shared_alloc_.alloc)->use_count = (local_88.shared_alloc_.alloc)->use_count + -1;
    local_50.shared_alloc_.alloc = (Alloc *)((local_88.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_88.shared_alloc_.alloc = (Alloc *)0x0;
  local_88.shared_alloc_.direct_ptr = (void *)0x0;
  Read<int>::Read((Read<signed_char> *)this,&local_50);
  pAVar3 = local_50.shared_alloc_.alloc;
  pvVar5 = extraout_RDX;
  if (((ulong)local_50.shared_alloc_.alloc & 7) == 0 && local_50.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_50.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_50.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
      pvVar5 = extraout_RDX_00;
    }
  }
  uVar8 = local_70.field_2._M_allocated_capacity;
  if ((local_70.field_2._M_allocated_capacity & 7) == 0 &&
      (Alloc *)local_70.field_2._M_allocated_capacity != (Alloc *)0x0) {
    piVar1 = (int *)(local_70.field_2._M_allocated_capacity + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_70.field_2._M_allocated_capacity);
      operator_delete((void *)uVar8,0x48);
      pvVar5 = extraout_RDX_01;
    }
  }
  _Var7._M_p = local_70._M_dataplus._M_p;
  if (((ulong)local_70._M_dataplus._M_p & 7) == 0 &&
      (Alloc *)local_70._M_dataplus._M_p != (Alloc *)0x0) {
    piVar1 = (int *)(local_70._M_dataplus._M_p + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_70._M_dataplus._M_p);
      operator_delete(_Var7._M_p,0x48);
      pvVar5 = extraout_RDX_02;
    }
  }
  pAVar3 = local_88.shared_alloc_.alloc;
  if (((ulong)local_88.shared_alloc_.alloc & 7) == 0 && local_88.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_88.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_88.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
      pvVar5 = extraout_RDX_03;
    }
  }
  LVar10.write_.shared_alloc_.direct_ptr = pvVar5;
  LVar10.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar10.write_.shared_alloc_;
}

Assistant:

LOs invert_funnel(LOs ab2a, LO na) {
  LO nab = ab2a.size();
  Write<LO> a2ab(na + 1, -1);
  a2ab.set(0, 0);
  auto f = OMEGA_H_LAMBDA(LO ab) {
    LO a_end = ab2a[ab];
    LO a_start = ab2a[ab + 1];
    if (a_end != a_start) {
      a2ab[a_end + 1] = ab + 1;
    }
  };
  parallel_for(max2(0, nab - 1), f, "invert_funnel");
  if (nab) {
    LO a_end = ab2a.get(nab - 1);
    a2ab.set(a_end + 1, nab);
  }
  fill_right(a2ab);
  return a2ab;
}